

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O0

void __thiscall
S2Cap::GetCellUnionBound(S2Cap *this,vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids)

{
  vector<S2CellId,_std::allocator<S2CellId>_> *this_00;
  double value;
  S2CellId local_3c;
  value_type local_34;
  int local_2c;
  S1Angle SStack_28;
  int face;
  int local_1c;
  vector<S2CellId,_std::allocator<S2CellId>_> *pvStack_18;
  int level;
  vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids_local;
  S2Cap *this_local;
  
  pvStack_18 = cell_ids;
  cell_ids_local = (vector<S2CellId,_std::allocator<S2CellId>_> *)this;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::clear(cell_ids);
  SStack_28 = GetRadius(this);
  value = S1Angle::radians(&stack0xffffffffffffffd8);
  local_1c = S2::Metric<1>::GetLevelForMinValue((Metric<1> *)&S2::kMinWidth,value);
  local_1c = local_1c + -1;
  if (local_1c < 0) {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve(pvStack_18,6);
    for (local_2c = 0; this_00 = pvStack_18, local_2c < 6; local_2c = local_2c + 1) {
      local_34.id_ = (uint64)S2CellId::FromFace(local_2c);
      std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(this_00,&local_34);
    }
  }
  else {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve(pvStack_18,4);
    S2CellId::S2CellId(&local_3c,&this->center_);
    S2CellId::AppendVertexNeighbors(&local_3c,local_1c,pvStack_18);
  }
  return;
}

Assistant:

void S2Cap::GetCellUnionBound(vector<S2CellId>* cell_ids) const {
  // TODO(ericv): The covering could be made quite a bit tighter by mapping
  // the cap to a rectangle in (i,j)-space and finding a covering for that.
  cell_ids->clear();

  // Find the maximum level such that the cap contains at most one cell vertex
  // and such that S2CellId::AppendVertexNeighbors() can be called.
  int level = S2::kMinWidth.GetLevelForMinValue(GetRadius().radians()) - 1;

  // If level < 0, then more than three face cells are required.
  if (level < 0) {
    cell_ids->reserve(6);
    for (int face = 0; face < 6; ++face) {
      cell_ids->push_back(S2CellId::FromFace(face));
    }
  } else {
    // The covering consists of the 4 cells at the given level that share the
    // cell vertex that is closest to the cap center.
    cell_ids->reserve(4);
    S2CellId(center_).AppendVertexNeighbors(level, cell_ids);
  }
}